

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall bloaty::ArgParser::ArgParser(ArgParser *this,int *argc,char ***argv)

{
  char **in_RDX;
  vector<char_*,_std::allocator<char_*>_> *in_RSI;
  undefined4 *in_RDI;
  ArgParser *this_00;
  allocator_type *in_stack_ffffffffffffffd8;
  char **in_stack_ffffffffffffffe0;
  
  *in_RDI = *(undefined4 *)
             &(in_RSI->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
  this_00 = (ArgParser *)(in_RDI + 2);
  std::allocator<char_*>::allocator((allocator<char_*> *)0x18100b);
  std::vector<char*,std::allocator<char*>>::vector<char**,void>
            (in_RSI,in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::allocator<char_*>::~allocator((allocator<char_*> *)0x181030);
  *(vector<char_*,_std::allocator<char_*>_> **)(in_RDI + 8) = in_RSI;
  *(char ***)(in_RDI + 10) = in_RDX;
  in_RDI[0xc] = 0;
  **(undefined4 **)(in_RDI + 8) = 0;
  ConsumeAndSaveArg(this_00);
  return;
}

Assistant:

ArgParser(int* argc, char** argv[])
      : argc_(*argc),
        argv_(*argv, *argv + *argc),
        out_argc_(argc),
        out_argv_(argv) {
    *out_argc_ = 0;
    ConsumeAndSaveArg();  // Executable name.
  }